

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.h
# Opt level: O0

void __thiscall
Connection::readUntil<ByteLimit>(Connection *this,ByteLimit *condition,ReadCallback *callback)

{
  function<void_(const_boost::system::error_code_&,_std::basic_istream<char,_std::char_traits<char>_>_&)>
  local_a8;
  shared_ptr<Connection> local_78;
  bind_t<void,_boost::_mfi::mf3<void,_Connection,_const_boost::system::error_code_&,_unsigned_long,_boost::function<void_(const_boost::system::error_code_&,_std::basic_istream<char,_std::char_traits<char>_>_&)>_&>,_boost::_bi::list4<boost::_bi::value<boost::shared_ptr<Connection>_>,_boost::arg<1>_(*)(),_boost::arg<2>_(*)(),_boost::_bi::value<boost::function<void_(const_boost::system::error_code_&,_std::basic_istream<char,_std::char_traits<char>_>_&)>_>_>_>
  local_68;
  ByteLimit local_28;
  ReadCallback *local_20;
  ReadCallback *callback_local;
  ByteLimit *condition_local;
  Connection *this_local;
  
  local_20 = callback;
  callback_local = (ReadCallback *)condition;
  condition_local = (ByteLimit *)this;
  ByteLimit::ByteLimit(&local_28,condition);
  boost::enable_shared_from_this<Connection>::shared_from_this
            ((enable_shared_from_this<Connection> *)&local_78);
  boost::
  function<void_(const_boost::system::error_code_&,_std::basic_istream<char,_std::char_traits<char>_>_&)>
  ::function(&local_a8,callback);
  boost::
  bind<void,Connection,boost::system::error_code_const&,unsigned_long,boost::function<void(boost::system::error_code_const&,std::istream&)>&,boost::shared_ptr<Connection>,boost::arg<1>(*)(),boost::arg<2>(*)(),boost::function<void(boost::system::error_code_const&,std::istream&)>>
            (&local_68,(boost *)_readHandler,0,&local_78,boost::asio::placeholders::error,
             boost::asio::placeholders::bytes_transferred,&local_a8);
  boost::asio::
  async_read_until<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,std::allocator<char>,ByteLimit,boost::_bi::bind_t<void,boost::_mfi::mf3<void,Connection,boost::system::error_code_const&,unsigned_long,boost::function<void(boost::system::error_code_const&,std::istream&)>&>,boost::_bi::list4<boost::_bi::value<boost::shared_ptr<Connection>>,boost::arg<1>(*)(),boost::arg<2>(*)(),boost::_bi::value<boost::function<void(boost::system::error_code_const&,std::istream&)>>>>>
            (&this->m_socket,&this->m_readBuffer,&local_28,&local_68,(type *)0x0);
  boost::_bi::
  bind_t<void,_boost::_mfi::mf3<void,_Connection,_const_boost::system::error_code_&,_unsigned_long,_boost::function<void_(const_boost::system::error_code_&,_std::basic_istream<char,_std::char_traits<char>_>_&)>_&>,_boost::_bi::list4<boost::_bi::value<boost::shared_ptr<Connection>_>,_boost::arg<1>_(*)(),_boost::arg<2>_(*)(),_boost::_bi::value<boost::function<void_(const_boost::system::error_code_&,_std::basic_istream<char,_std::char_traits<char>_>_&)>_>_>_>
  ::~bind_t(&local_68);
  boost::
  function<void_(const_boost::system::error_code_&,_std::basic_istream<char,_std::char_traits<char>_>_&)>
  ::~function(&local_a8);
  boost::shared_ptr<Connection>::~shared_ptr(&local_78);
  ByteLimit::~ByteLimit(&local_28);
  return;
}

Assistant:

void readUntil( Condition condition, ReadCallback callback ){
        boost::asio::async_read_until(
            m_socket,
            m_readBuffer,
            condition,
            boost::bind(
                &Connection::_readHandler,
                shared_from_this(),
                boost::asio::placeholders::error,
                boost::asio::placeholders::bytes_transferred,
                callback
            )
        );
    }